

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationWeights::incWeightByOffset
          (CollationWeights *this,uint32_t weight,int32_t length,int32_t offset)

{
  uint uVar1;
  uint byte;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  uint32_t *puVar5;
  
  iVar4 = length * -8 + 0x20;
  puVar5 = this->maxBytes + length;
  while( true ) {
    byte = (weight >> ((byte)iVar4 & 0x1f) & 0xff) + offset;
    if (byte <= *puVar5) break;
    uVar1 = puVar5[-5];
    iVar3 = (*puVar5 - uVar1) + 1;
    offset = (int)(byte - uVar1) / iVar3;
    weight = setWeightByte(weight,length,(int)(byte - uVar1) % iVar3 + uVar1);
    length = length + -1;
    iVar4 = iVar4 + 8;
    puVar5 = puVar5 + -1;
  }
  uVar2 = setWeightByte(weight,length,byte);
  return uVar2;
}

Assistant:

uint32_t
CollationWeights::incWeightByOffset(uint32_t weight, int32_t length, int32_t offset) const {
    for(;;) {
        offset += getWeightByte(weight, length);
        if((uint32_t)offset <= maxBytes[length]) {
            return setWeightByte(weight, length, offset);
        } else {
            // Split the offset between this byte and the previous one.
            offset -= minBytes[length];
            weight = setWeightByte(weight, length, minBytes[length] + offset % countBytes(length));
            offset /= countBytes(length);
            --length;
            U_ASSERT(length > 0);
        }
    }
}